

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O2

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundColumnRefExpression::Deserialize
          (BoundColumnRefExpression *this,Deserializer *deserializer)

{
  unsigned_long depth;
  BoundColumnRefExpression *this_00;
  ColumnBinding binding;
  LogicalType return_type;
  LogicalType local_48;
  
  Deserializer::ReadProperty<duckdb::LogicalType>(&return_type,deserializer,200,"return_type");
  binding = Deserializer::ReadProperty<duckdb::ColumnBinding>(deserializer,0xc9,"binding");
  depth = Deserializer::ReadPropertyWithDefault<unsigned_long>(deserializer,0xca,"depth");
  this_00 = (BoundColumnRefExpression *)operator_new(0x70);
  LogicalType::LogicalType(&local_48,&return_type);
  BoundColumnRefExpression(this_00,&local_48,binding,depth);
  LogicalType::~LogicalType(&local_48);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  LogicalType::~LogicalType(&return_type);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundColumnRefExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto binding = deserializer.ReadProperty<ColumnBinding>(201, "binding");
	auto depth = deserializer.ReadPropertyWithDefault<idx_t>(202, "depth");
	auto result = duckdb::unique_ptr<BoundColumnRefExpression>(new BoundColumnRefExpression(std::move(return_type), binding, depth));
	return std::move(result);
}